

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::SubmitCborRecords
          (DnsStats *this,cdns *cdns_ctx,cdns_query *query,cdns_query_signature *q_sig,
          cdns_qr_extended *ext,bool is_response)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cdns_query_signature *pcVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  pointer piVar11;
  ulong uVar12;
  uint uVar13;
  int rrtype;
  long lVar14;
  undefined7 in_register_00000089;
  long lVar15;
  bool stored;
  int local_fc;
  uint32_t e_length;
  uint32_t e_rcode;
  cdns_query_signature *local_f0;
  int local_e4;
  cdns_query *local_e0;
  uint local_d8;
  uint local_d4;
  DnsStats *local_d0;
  cdns *local_c8;
  uint32_t *local_c0;
  uint32_t *local_b8;
  pointer local_b0;
  long local_a8;
  pointer local_a0;
  DnsHashEntry local_98;
  
  local_fc = (int)CONCAT71(in_register_00000089,is_response);
  piVar9 = &q_sig->query_rcode;
  if (local_fc != 0) {
    piVar9 = &q_sig->response_rcode;
  }
  local_d8 = *piVar9;
  e_rcode = 0;
  e_length = 0x200;
  uVar13 = 0xffffffff;
  local_f0 = q_sig;
  local_e0 = query;
  if (ext->is_filled == true) {
    local_98.HashNext = *(DnsHashEntry **)ext;
    local_98.hash = ext->authority_index;
    local_98.registry_id = ext->additional_index;
    if (-1 < ext->question_index) {
      lVar10 = (long)q_sig->query_classtype_index - (long)cdns_ctx->index_offset;
      lVar14 = (long)query->query_name_index - (long)cdns_ctx->index_offset;
      pcVar2 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitQueryContent(this,pcVar2[lVar10].rr_type,pcVar2[lVar10].rr_class,pcVar3[lVar14].v,
                         (uint32_t)pcVar3[lVar14].l,0);
    }
    uVar13 = 0xffffffff;
    lVar10 = 1;
    local_d0 = this;
    local_c8 = cdns_ctx;
    do {
      lVar14 = (long)*(int *)((long)&local_98.HashNext + lVar10 * 4);
      if (-1 < lVar14) {
        lVar14 = lVar14 - cdns_ctx->index_offset;
        pcVar4 = (cdns_ctx->block).tables.rr_list.
                 super__Vector_base<cdns_rr_list,_std::allocator<cdns_rr_list>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar11 = *(pointer *)
                   &pcVar4[lVar14].rr_index.super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (*(pointer *)
             ((long)&pcVar4[lVar14].rr_index.super__Vector_base<int,_std::allocator<int>_>._M_impl +
             8) != piVar11) {
          local_b0 = pcVar4 + lVar14;
          local_b8 = (uint32_t *)0x0;
          if (lVar10 == 3) {
            local_b8 = &e_rcode;
          }
          local_c0 = (uint32_t *)0x0;
          if (lVar10 == 3) {
            local_c0 = &e_length;
          }
          uVar12 = 0;
          local_a8 = lVar10;
          do {
            lVar10 = (long)cdns_ctx->index_offset;
            lVar15 = piVar11[uVar12] - lVar10;
            pcVar2 = (cdns_ctx->block).tables.class_ids.
                     super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_a0 = (cdns_ctx->block).tables.rrs.
                       super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
                       super__Vector_impl_data._M_start;
            lVar14 = local_a0[lVar15].classtype_index - lVar10;
            iVar8 = local_a0[lVar15].rdata_index;
            iVar1 = local_a0[lVar15].name_index;
            rrtype = pcVar2[lVar14].rr_type;
            local_d4 = uVar13;
            if (rrtype == 0x29) {
              local_e4 = local_f0->udp_buf_size;
              uVar7 = cdns::get_edns_flags(local_f0->qr_dns_flags);
              uVar13 = uVar7 | 0x8000;
              if (local_d0->dnssec_packet == (uint8_t *)0x0) {
                uVar13 = uVar7;
              }
              rrtype = (local_c8->block).tables.class_ids.
                       super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14].rr_type;
              cdns_ctx = local_c8;
            }
            else {
              local_e4 = pcVar2[lVar14].rr_class;
              uVar13 = local_a0[lVar15].ttl;
            }
            this = local_d0;
            lVar14 = iVar8 - lVar10;
            lVar10 = iVar1 - lVar10;
            pcVar3 = (cdns_ctx->block).tables.name_rdata.
                     super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
                     super__Vector_impl_data._M_start;
            SubmitRecordContent(local_d0,rrtype,local_e4,uVar13,(int)pcVar3[lVar14].l,
                                pcVar3[lVar14].v,pcVar3[lVar10].v,(uint32_t)pcVar3[lVar10].l,0,
                                local_b8,local_c0,(bool)(char)local_fc);
            uVar7 = local_d4;
            if ((int)local_d4 < 0) {
              uVar7 = local_a0[lVar15].name_index;
            }
            uVar13 = local_d4;
            if (local_a8 != 3) {
              uVar13 = uVar7;
            }
            uVar12 = uVar12 + 1;
            piVar11 = *(pointer *)
                       &(local_b0->rr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl;
            lVar10 = local_a8;
          } while (uVar12 < (ulong)((long)*(pointer *)
                                           ((long)&(local_b0->rr_index).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl + 8) - (long)piVar11 >> 2));
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  pcVar5 = local_f0;
  if ((char)local_fc == '\0') {
    iVar8 = cdns::get_edns_flags(local_f0->qr_dns_flags);
    if (-1 < (long)pcVar5->opt_rdata_index) {
      lVar10 = (long)pcVar5->opt_rdata_index - (long)cdns_ctx->index_offset;
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitRecordContent(this,0x29,local_f0->udp_buf_size,iVar8,(int)pcVar3[lVar10].l,
                          pcVar3[lVar10].v,(uint8_t *)0x0,0,0,&e_rcode,&e_length,false);
    }
  }
  local_98.field_6.key_number = e_rcode << 4 | local_d8;
  local_98.HashNext = (DnsHashEntry *)0x0;
  stored = false;
  local_98.count = 1;
  local_98.hash = 0;
  local_98.registry_id = 4;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&stored);
  if ((this->dnsstat_flags & 0x10) == 0) {
    if ((char)local_fc == '\0') {
      return;
    }
  }
  else {
    if ((char)local_fc == '\0') {
      local_98.field_6.key_number = local_e0->query_size;
      local_98.HashNext = (DnsHashEntry *)0x0;
      stored = false;
      local_98.count = 1;
      local_98.hash = 0;
      local_98.registry_id = 0x13;
      local_98.key_type = 0;
      local_98.key_length = 4;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&stored);
      local_98.HashNext = (DnsHashEntry *)0x0;
      stored = false;
      local_98.count = 1;
      local_98.hash = 0;
      local_98.registry_id = 0x12;
      local_98.key_type = 0;
      local_98.key_length = 4;
      local_98.field_6.key_number = e_length;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&stored);
      return;
    }
    local_98.field_6.key_number = local_e0->response_size;
    local_98.HashNext = (DnsHashEntry *)0x0;
    stored = false;
    local_98.count = 1;
    local_98.hash = 0;
    local_98.registry_id = 0x14;
    local_98.key_type = 0;
    local_98.key_length = 4;
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&stored);
    uVar7 = cdns::get_dns_flags(local_f0->qr_dns_flags,true);
    if ((uVar7 & 0x20) != 0) {
      local_98.HashNext = (DnsHashEntry *)0x0;
      stored = false;
      local_98.count = 1;
      local_98.hash = 0;
      local_98.registry_id = 0x15;
      local_98.key_type = 0;
      local_98.key_length = 4;
      local_98.field_6.key_number = e_length;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&stored);
    }
  }
  if (-1 < (int)uVar13) {
    lVar10 = (long)cdns_ctx->index_offset;
    lVar14 = local_e0->query_name_index - lVar10;
    pcVar3 = (cdns_ctx->block).tables.name_rdata.
             super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar3[lVar14].l != 0) {
      lVar15 = local_f0->query_classtype_index - lVar10;
      pcVar2 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = false;
      if ((pcVar2[lVar15].rr_class == 1) && (uVar6 = false, pcVar2[lVar15].rr_type - 1U < 2)) {
        iVar8 = Compare2DnsNames(pcVar3[lVar14].v,(uint32_t)pcVar3[lVar14].l,0,
                                 pcVar3[(ulong)uVar13 - lVar10].v,
                                 (uint32_t)pcVar3[(ulong)uVar13 - lVar10].l,0);
        uVar6 = (undefined1)iVar8;
      }
      this->is_qname_minimized = (bool)uVar6;
      return;
    }
  }
  this->is_qname_minimized = true;
  return;
}

Assistant:

void DnsStats::SubmitCborRecords(cdns* cdns_ctx, cdns_query* query, cdns_query_signature* q_sig,
    cdns_qr_extended * ext, bool is_response)
{
    uint32_t rcode = (is_response) ? q_sig->response_rcode : q_sig->query_rcode;
    uint32_t e_rcode = 0;
    uint32_t e_length = 512;
    int first_rname_index = -1;


    if (ext->is_filled) {
        int x_i[4] = { ext->question_index, ext->answer_index, ext->authority_index, ext->additional_index };

        if (x_i[0] >= 0) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            SubmitQueryContent(cdns_ctx->block.tables.class_ids[cid].rr_type,
                cdns_ctx->block.tables.class_ids[cid].rr_class,
                cdns_ctx->block.tables.name_rdata[nid].v,
                (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0);
        }

        for (int i = 1; i < 4; i++) {
            if (x_i[i] >= 0) {
                cdns_rr_list* list = &cdns_ctx->block.tables.rr_list[(size_t)x_i[i]- cdns_ctx->index_offset];

                for (size_t j = 0; j < list->rr_index.size(); j++) {
                    cdns_rr_field * rr = &cdns_ctx->block.tables.rrs[(size_t)list->rr_index[j]- cdns_ctx->index_offset];
                    size_t cid = (size_t)rr->classtype_index - cdns_ctx->index_offset;
                    size_t rrid = (size_t) rr->rdata_index - cdns_ctx->index_offset;
                    size_t nid = (size_t)rr->name_index - cdns_ctx->index_offset;
                    int rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
                    int ttl = rr->ttl;

                    if (cdns_ctx->block.tables.class_ids[cid].rr_type == DnsRtype_OPT) {
                        rr_class = q_sig->udp_buf_size;
                        ttl = cdns::get_edns_flags(q_sig->qr_dns_flags);

                        if (dnssec_packet != NULL) {
                            ttl |= (1 << 15);
                        }
                    }

                    SubmitRecordContent(
                        cdns_ctx->block.tables.class_ids[cid].rr_type, rr_class, ttl,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[rrid].l,
                        cdns_ctx->block.tables.name_rdata[rrid].v,
                        cdns_ctx->block.tables.name_rdata[nid].v,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l,
                        0, (i == 3) ? &e_rcode : NULL, (i == 3) ? &e_length : NULL, is_response);
                    if (first_rname_index < 0 && i < 3) {
                        first_rname_index = rr->name_index;
                    }
                }
            }
        }
    }

    if (!is_response) {
        int edns_flags = cdns::get_edns_flags(q_sig->qr_dns_flags);
        if (q_sig->opt_rdata_index >= 0) {
            size_t opt_rrid = (size_t)q_sig->opt_rdata_index - cdns_ctx->index_offset;

            SubmitRecordContent(DnsRtype_OPT, q_sig->udp_buf_size, edns_flags,
                (uint32_t)cdns_ctx->block.tables.name_rdata[opt_rrid].l,
                cdns_ctx->block.tables.name_rdata[opt_rrid].v,
                NULL, 0, 0, &e_rcode, &e_length, is_response);
        }
    }

    
    rcode |= (e_rcode << 4);
    SubmitRegistryNumber(REGISTRY_DNS_RCODES, rcode);

    if ((dnsstat_flags & dnsStateFlagCountPacketSizes) != 0)
    {
        if (is_response)
        {
            SubmitRegistryNumber(REGISTRY_DNS_Response_Size, query->response_size);
            if ((cdns::get_dns_flags(q_sig->qr_dns_flags,true) & (1 << 5)) != 0)
            {
                SubmitRegistryNumber(REGISTRY_DNS_TC_length, e_length);
            }
        }
        else
        {
            SubmitRegistryNumber(REGISTRY_DNS_Query_Size, query->query_size);
            SubmitRegistryNumber(REGISTRY_EDNS_Packet_Size, e_length);
        }
    }

    if (is_response) {
        size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
        if (first_rname_index >= 0) {
            if (cdns_ctx->block.tables.name_rdata[nid].l == 0) {
                is_qname_minimized = true;
            }
            else {
                size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
                size_t rname_id = (size_t)first_rname_index - cdns_ctx->index_offset;

                is_qname_minimized = IsQNameMinimized(
                    1,
                    cdns_ctx->block.tables.class_ids[cid].rr_class,
                    cdns_ctx->block.tables.class_ids[cid].rr_type,
                    cdns_ctx->block.tables.name_rdata[nid].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0,
                    cdns_ctx->block.tables.name_rdata[rname_id].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[rname_id].l, 0);
            }
        }
        else {
            /* In the absence of further knowledge, assume that this is true. */
            is_qname_minimized = true;
        }
    }
}